

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

const_reference __thiscall
absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
operator[](InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
           *this,size_type i)

{
  ulong uVar1;
  Rep *pRVar2;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if (i < uVar1 >> 1) {
    if ((uVar1 & 1) == 0) {
      pRVar2 = &this->rep_;
    }
    else {
      pRVar2 = *(Rep **)((long)&this->rep_ + 8);
    }
    return (const_reference)(i * 0x38 + (long)pRVar2);
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0xf8,
                "const_reference absl::InlinedVector<s2shapeutil::ShapeEdge, 16>::operator[](size_type) const [T = s2shapeutil::ShapeEdge, N = 16, A = std::allocator<s2shapeutil::ShapeEdge>]"
               );
}

Assistant:

size_type size() const { return size_ / 2; }